

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblyModule::InitializeMemory(WebAssemblyModule *this,MemorySectionLimits *memoryLimits)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  WasmCompilationException *this_00;
  byte bVar6;
  
  if (memoryLimits == (MemorySectionLimits *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x13c,"((0))","UNREACHED");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    Wasm::WasmCompilationException::WasmCompilationException(this_00,L"Internal Error");
  }
  else if ((this->field_0x20 & 2) == 0) {
    uVar1 = (memoryLimits->super_SectionLimits).initial;
    uVar2 = (memoryLimits->super_SectionLimits).maximum;
    if (uVar2 < uVar1) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      Wasm::WasmCompilationException::WasmCompilationException
                (this_00,L"Memory: MaxPage (%u) must be greater than MinPage (%u)",(ulong)uVar2,
                 (ulong)uVar1);
    }
    else if (uVar1 < 0x10000) {
      if (uVar1 < 0x8000) {
        bVar6 = 2;
        bVar4 = Wasm::Threads::IsEnabled();
        if (bVar4) {
          bVar6 = (char)(memoryLimits->super_SectionLimits).flags * '\x02' & 4U | 2;
        }
        this->field_0x20 = this->field_0x20 & 0xf9 | bVar6;
        this->m_memoryInitSize = uVar1;
        this->m_memoryMaxSize = uVar2;
        return;
      }
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      Wasm::WasmCompilationException::WasmCompilationException
                (this_00,L"Memory: Unable to allocate minimum pages (%u)",(ulong)uVar1);
    }
    else {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      Wasm::WasmCompilationException::WasmCompilationException
                (this_00,L"Memory: Unable to allocate minimum pages (%u)",(ulong)uVar1);
    }
  }
  else {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    Wasm::WasmCompilationException::WasmCompilationException(this_00,L"Memory already allocated");
  }
  __cxa_throw(this_00,&Wasm::WasmCompilationException::typeinfo,
              Wasm::WasmCompilationException::~WasmCompilationException);
}

Assistant:

void
WebAssemblyModule::InitializeMemory(_In_ Wasm::MemorySectionLimits* memoryLimits)
{
    if (!memoryLimits)
    {
        Assert(UNREACHED);
        throw Wasm::WasmCompilationException(_u("Internal Error"));
    }
    if (m_hasMemory)
    {
        throw Wasm::WasmCompilationException(_u("Memory already allocated"));
    }

    uint32 minPage = memoryLimits->initial;
    uint32 maxPage = memoryLimits->maximum;

    if (maxPage < minPage)
    {
        throw Wasm::WasmCompilationException(_u("Memory: MaxPage (%u) must be greater than MinPage (%u)"), maxPage, minPage);
    }
    auto minPageTooBig = [minPage] {
        throw Wasm::WasmCompilationException(_u("Memory: Unable to allocate minimum pages (%u)"), minPage);
    };
    uint32 minBytes = UInt32Math::Mul<WebAssembly::PageSize>(minPage, minPageTooBig);
    if (minBytes > ArrayBuffer::MaxArrayBufferLength)
    {
        minPageTooBig();
    }

    m_memoryIsShared = Wasm::Threads::IsEnabled() && memoryLimits->IsShared();
    m_hasMemory = true;
    m_memoryInitSize = minPage;
    m_memoryMaxSize = maxPage;
}